

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.h
# Opt level: O3

void __thiscall
jaegertracing::Tag::Tag<std::__cxx11::string&>
          (Tag *this,string *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  pointer pcVar1;
  
  (this->_key)._M_dataplus._M_p = (pointer)&(this->_key).field_2;
  pcVar1 = (key->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + key->_M_string_length);
  opentracing::v3::util::
  variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
  ::
  variant<std::__cxx11::string_const&,opentracing::v3::util::detail::value_traits<std::__cxx11::string_const&,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
            ((variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
              *)&this->_value,value);
  return;
}

Assistant:

Tag(const std::string& key, ValueArg&& value)
        : _key(key)
        , _value(std::forward<ValueArg>(value))
    {
    }